

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

size_t mbuf_insert(mbuf *a,size_t off,void *buf,size_t len)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char *p;
  size_t len_local;
  void *buf_local;
  size_t off_local;
  mbuf *a_local;
  
  if (a == (mbuf *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x583,"size_t mbuf_insert(struct mbuf *, size_t, const void *, size_t)");
  }
  if (a->size < a->len) {
    __assert_fail("a->len <= a->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x584,"size_t mbuf_insert(struct mbuf *, size_t, const void *, size_t)");
  }
  if (a->len < off) {
    __assert_fail("off <= a->len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x585,"size_t mbuf_insert(struct mbuf *, size_t, const void *, size_t)");
  }
  if (-(long)a->buf - 1U < len) {
    a_local = (mbuf *)0x0;
  }
  else {
    p = (char *)len;
    if (a->size < a->len + len) {
      lVar2 = a->len + len;
      auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar6._0_8_ = lVar2;
      auVar6._12_4_ = 0x45300000;
      dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 1.5;
      uVar4 = (ulong)dVar5;
      pcVar3 = (char *)realloc(a->buf,uVar4 | (long)(dVar5 - 9.223372036854776e+18) &
                                              (long)uVar4 >> 0x3f);
      if (pcVar3 == (char *)0x0) {
        p = (char *)0x0;
      }
      else {
        a->buf = pcVar3;
        memmove(a->buf + len + off,a->buf + off,a->len - off);
        if (buf != (void *)0x0) {
          memcpy(a->buf + off,buf,len);
        }
        a->len = a->len + len;
        sVar1 = a->len;
        auVar7._8_4_ = (int)(sVar1 >> 0x20);
        auVar7._0_8_ = sVar1;
        auVar7._12_4_ = 0x45300000;
        dVar5 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
        uVar4 = (ulong)dVar5;
        a->size = uVar4 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f;
      }
    }
    else {
      memmove(a->buf + len + off,a->buf + off,a->len - off);
      if (buf != (void *)0x0) {
        memcpy(a->buf + off,buf,len);
      }
      a->len = len + a->len;
    }
    a_local = (mbuf *)p;
  }
  return (size_t)a_local;
}

Assistant:

size_t mbuf_insert(struct mbuf *a, size_t off, const void *buf, size_t len) {
    char *p = NULL;

    assert(a != NULL);
    assert(a->len <= a->size);
    assert(off <= a->len);

    /* check overflow */
    if (~(size_t) 0 - (size_t) a->buf < len) return 0;

    if (a->len + len <= a->size) {
        memmove(a->buf + off + len, a->buf + off, a->len - off);
        if (buf != NULL) {
            memcpy(a->buf + off, buf, len);
        }
        a->len += len;
    } else if ((p = (char *) MBUF_REALLOC(
            a->buf, (a->len + len) * MBUF_SIZE_MULTIPLIER)) != NULL) {
        a->buf = p;
        memmove(a->buf + off + len, a->buf + off, a->len - off);
        if (buf != NULL) {
            memcpy(a->buf + off, buf, len);
        }
        a->len += len;
        a->size = a->len * MBUF_SIZE_MULTIPLIER;
    } else {
        len = 0;
    }

    return len;
}